

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

Argument * dg::vr::getArgument(ValueRelations *graph,Handle h)

{
  bool bVar1;
  iterator this;
  reference ppVar2;
  Argument *pAVar3;
  _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
  *in_RDI;
  Argument *arg;
  pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations> handleRel;
  iterator __end2;
  iterator __begin2;
  RelationsMap *__range2;
  Argument *result;
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  *in_stack_ffffffffffffff68;
  Relations *in_stack_ffffffffffffff88;
  Bucket *in_stack_ffffffffffffff90;
  Handle h_00;
  _Self in_stack_ffffffffffffff98;
  _Self local_60;
  undefined1 local_58 [8];
  undefined1 local_50 [48];
  undefined1 *local_20;
  Argument *local_18;
  
  local_18 = (Argument *)0x0;
  memset(local_58,0,8);
  Relations::Relations((Relations *)0x1cd6d8);
  Relations::sle((Relations *)0x1cd6e2);
  Relations::sge((Relations *)0x1cd6ea);
  ValueRelations::getRelated<dg::vr::Bucket>
            ((ValueRelations *)in_stack_ffffffffffffff98._M_node,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  local_20 = local_50;
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
       ::begin(in_stack_ffffffffffffff68);
  this = std::
         map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
         ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = std::operator!=(&local_60,(_Self *)&stack0xffffffffffffff98);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                          *)0x1cd752);
    h_00 = (Handle)(ppVar2->second).bits.super__Base_bitset<1UL>._M_w;
    std::reference_wrapper::operator_cast_to_Bucket_
              ((reference_wrapper<const_dg::vr::Bucket> *)0x1cd779);
    pAVar3 = ValueRelations::getInstance<llvm::Argument>((ValueRelations *)this._M_node,h_00);
    if (pAVar3 != (Argument *)0x0) {
      local_18 = pAVar3;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
    ::operator++(in_RDI);
  }
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::~map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
          *)0x1cd746);
  return local_18;
}

Assistant:

const llvm::Argument *getArgument(const ValueRelations &graph,
                                  ValueRelations::Handle h) {
    const llvm::Argument *result = nullptr;
    for (auto handleRel : graph.getRelated(h, Relations().sle().sge())) {
        const llvm::Argument *arg =
                graph.getInstance<llvm::Argument>(handleRel.first);
        if (arg) {
            assert(!result);
            result = arg;
        }
    }
    return result;
}